

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O3

void av1_dist_wtd_convolve_y_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  short *psVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  undefined4 uVar127;
  undefined4 uVar128;
  undefined4 uVar129;
  undefined4 uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined1 auVar191 [15];
  undefined1 auVar192 [15];
  undefined1 auVar193 [15];
  undefined1 auVar194 [15];
  undefined1 auVar195 [15];
  undefined1 auVar196 [15];
  undefined1 auVar197 [15];
  undefined1 auVar198 [15];
  ulong uVar199;
  uint uVar200;
  uint8_t *puVar201;
  undefined1 (*pauVar202) [16];
  undefined1 (*pauVar203) [16];
  uint8_t *puVar204;
  int iVar205;
  long lVar206;
  uint8_t *puVar207;
  char cVar208;
  int iVar209;
  long lVar210;
  uint8_t *puVar211;
  uint8_t *puVar212;
  long lVar213;
  long lVar214;
  long lVar215;
  short sVar216;
  short sVar226;
  short sVar227;
  short sVar228;
  short sVar229;
  short sVar230;
  short sVar231;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  short sVar232;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 uVar239;
  undefined1 uVar240;
  undefined4 uVar233;
  undefined1 auVar235 [16];
  int iVar234;
  undefined1 uVar241;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  short sVar242;
  short sVar259;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 uVar282;
  undefined1 uVar283;
  undefined1 uVar284;
  undefined1 uVar286;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar268 [16];
  undefined1 auVar275 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  short sVar324;
  short sVar325;
  undefined1 uVar326;
  undefined1 uVar327;
  undefined1 uVar330;
  undefined1 uVar331;
  undefined1 uVar332;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 uVar342;
  undefined1 uVar343;
  undefined1 auVar333 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined2 uVar344;
  undefined1 auVar345 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  byte bVar358;
  undefined1 uVar376;
  byte bVar377;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar368 [16];
  undefined1 local_148 [16];
  undefined1 auVar224 [16];
  undefined1 auVar247 [16];
  undefined1 auVar254 [16];
  undefined1 auVar248 [16];
  undefined1 auVar255 [16];
  undefined1 auVar249 [16];
  undefined1 auVar256 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  byte bVar285;
  undefined1 auVar300 [16];
  undefined1 auVar311 [16];
  undefined1 auVar301 [16];
  undefined1 auVar312 [16];
  undefined1 auVar302 [16];
  undefined1 auVar313 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  
  pauVar202 = (undefined1 (*) [16])conv_params->dst;
  lVar213 = (long)conv_params->dst_stride;
  iVar205 = 7 - conv_params->round_0;
  piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps;
  uVar127 = *(undefined4 *)piVar1;
  uVar128 = *(undefined4 *)(piVar1 + 2);
  uVar129 = *(undefined4 *)(piVar1 + 4);
  uVar130 = *(undefined4 *)(piVar1 + 6);
  iVar209 = conv_params->round_0 + conv_params->round_1;
  cVar208 = (char)iVar209;
  lVar206 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
  puVar211 = src + -lVar206;
  uVar233 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  auVar243 = ZEXT416((uint)((1 << (0x15U - cVar208 & 0x1f)) + (1 << (0x16U - cVar208 & 0x1f))));
  uVar200 = 0xe - iVar209;
  auVar235 = ZEXT416((uint)(1 << ((byte)uVar200 & 0x1f)) >> 1);
  iVar209 = conv_params->do_average;
  auVar287 = ZEXT416((uint)conv_params->round_1);
  iVar6 = conv_params->use_dist_wtd_comp_avg;
  auVar243 = pshuflw(auVar243,auVar243,0);
  auVar235 = pshuflw(auVar235,auVar235,0);
  iVar234 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  lVar214 = (long)src_stride;
  sVar242 = auVar243._0_2_;
  sVar259 = auVar243._2_2_;
  sVar324 = auVar235._0_2_;
  sVar325 = auVar235._2_2_;
  if (w == 4) {
    uVar7 = *(undefined4 *)puVar211;
    uVar8 = *(undefined4 *)(puVar211 + lVar214);
    uVar376 = (undefined1)((uint)uVar8 >> 0x18);
    uVar343 = (undefined1)((uint)uVar8 >> 0x10);
    uVar342 = (undefined1)((uint)uVar8 >> 8);
    uVar9 = *(undefined4 *)(puVar211 + lVar214 * 2);
    uVar241 = (undefined1)((uint)uVar9 >> 0x18);
    uVar240 = (undefined1)((uint)uVar9 >> 0x10);
    uVar239 = (undefined1)((uint)uVar9 >> 8);
    uVar10 = *(undefined4 *)(puVar211 + lVar214 * 3);
    uVar284 = (undefined1)((uint)uVar10 >> 0x18);
    uVar283 = (undefined1)((uint)uVar10 >> 0x10);
    uVar282 = (undefined1)((uint)uVar10 >> 8);
    uVar11 = *(undefined4 *)(puVar211 + lVar214 * 4);
    uVar327 = (undefined1)((uint)uVar11 >> 0x18);
    uVar326 = (undefined1)((uint)uVar11 >> 0x10);
    uVar286 = (undefined1)((uint)uVar11 >> 8);
    uVar12 = *(undefined4 *)(puVar211 + lVar214 * 5);
    uVar332 = (undefined1)((uint)uVar12 >> 0x18);
    uVar331 = (undefined1)((uint)uVar12 >> 0x10);
    uVar330 = (undefined1)((uint)uVar12 >> 8);
    uVar13 = *(undefined4 *)(puVar211 + lVar214 * 6);
    uVar4 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar332,uVar327),uVar331),
                                                      CONCAT14(uVar326,uVar11)) >> 0x20),uVar330),
                              uVar286),CONCAT11((char)uVar12,(char)uVar11));
    uVar5 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar13 >> 0x18)
                                                                        ,uVar332),
                                                               (char)((uint)uVar13 >> 0x10)),
                                                      CONCAT14(uVar331,uVar12)) >> 0x20),
                                       (char)((uint)uVar13 >> 8)),uVar330),
                     CONCAT11((char)uVar13,(char)uVar12));
    uVar3 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar284,uVar241),uVar283),
                                                      CONCAT14(uVar240,uVar9)) >> 0x20),uVar282),
                              uVar239),CONCAT11((char)uVar10,(char)uVar9));
    uVar199 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar327,uVar284),uVar326),
                                                        CONCAT14(uVar283,uVar10)) >> 0x20),uVar286),
                                uVar282),CONCAT11((char)uVar11,(char)uVar10));
    uVar125 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar376,(char)((uint)uVar7
                                                                                        >> 0x18)),
                                                                 uVar343),
                                                        CONCAT14((char)((uint)uVar7 >> 0x10),uVar7))
                                              >> 0x20),uVar342),(char)((uint)uVar7 >> 8)),
                       CONCAT11((char)uVar8,(char)uVar7));
    uVar126 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar241,uVar376),uVar240),
                                                        CONCAT14(uVar343,uVar8)) >> 0x20),uVar239),
                                uVar342),CONCAT11((char)uVar9,(char)uVar8));
    do {
      uVar124 = uVar199;
      uVar123 = uVar3;
      uVar199 = uVar5;
      uVar3 = uVar4;
      uVar7 = *(undefined4 *)(puVar211 + lVar214 * 7);
      uVar241 = (undefined1)((uint)uVar7 >> 0x18);
      uVar284 = (undefined1)((uint)uVar13 >> 0x18);
      uVar240 = (undefined1)((uint)uVar7 >> 0x10);
      uVar283 = (undefined1)((uint)uVar13 >> 0x10);
      uVar239 = (undefined1)((uint)uVar7 >> 8);
      uVar282 = (undefined1)((uint)uVar13 >> 8);
      bVar285 = (byte)uVar7;
      uVar344 = CONCAT11(bVar285,(byte)uVar13);
      uVar4 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar241,uVar284),uVar240),
                                                        CONCAT14(uVar283,uVar13)) >> 0x20),uVar239),
                                uVar282),uVar344);
      auVar29._8_6_ = 0;
      auVar29._0_8_ = uVar125;
      auVar29[0xe] = (char)(uVar125 >> 0x38);
      auVar45._8_4_ = 0;
      auVar45._0_8_ = uVar125;
      auVar45[0xc] = (char)(uVar125 >> 0x30);
      auVar45._13_2_ = auVar29._13_2_;
      auVar61._8_4_ = 0;
      auVar61._0_8_ = uVar125;
      auVar61._12_3_ = auVar45._12_3_;
      auVar77._8_2_ = 0;
      auVar77._0_8_ = uVar125;
      auVar77[10] = (char)(uVar125 >> 0x28);
      auVar77._11_4_ = auVar61._11_4_;
      auVar93._8_2_ = 0;
      auVar93._0_8_ = uVar125;
      auVar93._10_5_ = auVar77._10_5_;
      auVar109[8] = (char)(uVar125 >> 0x20);
      auVar109._0_8_ = uVar125;
      auVar109._9_6_ = auVar93._9_6_;
      auVar151._7_8_ = 0;
      auVar151._0_7_ = auVar109._8_7_;
      auVar167._1_8_ = SUB158(auVar151 << 0x40,7);
      auVar167[0] = (char)(uVar125 >> 0x18);
      auVar167._9_6_ = 0;
      auVar168._1_10_ = SUB1510(auVar167 << 0x30,5);
      auVar168[0] = (char)(uVar125 >> 0x10);
      auVar168._11_4_ = 0;
      auVar217._3_12_ = SUB1512(auVar168 << 0x20,3);
      auVar217[2] = (char)(uVar125 >> 8);
      auVar217[0] = (byte)uVar125;
      auVar217[1] = 0;
      auVar217[0xf] = 0;
      auVar15._8_6_ = 0;
      auVar15._0_8_ = uVar123;
      auVar15[0xe] = (char)(uVar123 >> 0x38);
      auVar30._8_4_ = 0;
      auVar30._0_8_ = uVar123;
      auVar30[0xc] = (char)(uVar123 >> 0x30);
      auVar30._13_2_ = auVar15._13_2_;
      auVar46._8_4_ = 0;
      auVar46._0_8_ = uVar123;
      auVar46._12_3_ = auVar30._12_3_;
      auVar62._8_2_ = 0;
      auVar62._0_8_ = uVar123;
      auVar62[10] = (char)(uVar123 >> 0x28);
      auVar62._11_4_ = auVar46._11_4_;
      auVar78._8_2_ = 0;
      auVar78._0_8_ = uVar123;
      auVar78._10_5_ = auVar62._10_5_;
      auVar94[8] = (char)(uVar123 >> 0x20);
      auVar94._0_8_ = uVar123;
      auVar94._9_6_ = auVar78._9_6_;
      auVar152._7_8_ = 0;
      auVar152._0_7_ = auVar94._8_7_;
      auVar169._1_8_ = SUB158(auVar152 << 0x40,7);
      auVar169[0] = (char)(uVar123 >> 0x18);
      auVar169._9_6_ = 0;
      auVar170._1_10_ = SUB1510(auVar169 << 0x30,5);
      auVar170[0] = (char)(uVar123 >> 0x10);
      auVar170._11_4_ = 0;
      auVar111[2] = (char)(uVar123 >> 8);
      auVar111._0_2_ = (ushort)uVar123;
      auVar111._3_12_ = SUB1512(auVar170 << 0x20,3);
      auVar244._0_2_ = (ushort)uVar123 & 0xff;
      auVar244._2_13_ = auVar111._2_13_;
      auVar244[0xf] = 0;
      auVar147._4_4_ = uVar127;
      auVar147._0_4_ = uVar127;
      auVar147._8_4_ = uVar127;
      auVar147._12_4_ = uVar127;
      auVar235 = pmaddwd(auVar217,auVar147);
      auVar143._4_4_ = uVar128;
      auVar143._0_4_ = uVar128;
      auVar143._8_4_ = uVar128;
      auVar143._12_4_ = uVar128;
      auVar245 = pmaddwd(auVar244,auVar143);
      auVar16._8_6_ = 0;
      auVar16._0_8_ = uVar3;
      auVar16[0xe] = (char)(uVar3 >> 0x38);
      auVar31._8_4_ = 0;
      auVar31._0_8_ = uVar3;
      auVar31[0xc] = (char)(uVar3 >> 0x30);
      auVar31._13_2_ = auVar16._13_2_;
      auVar47._8_4_ = 0;
      auVar47._0_8_ = uVar3;
      auVar47._12_3_ = auVar31._12_3_;
      auVar63._8_2_ = 0;
      auVar63._0_8_ = uVar3;
      auVar63[10] = (char)(uVar3 >> 0x28);
      auVar63._11_4_ = auVar47._11_4_;
      auVar79._8_2_ = 0;
      auVar79._0_8_ = uVar3;
      auVar79._10_5_ = auVar63._10_5_;
      auVar95[8] = (char)(uVar3 >> 0x20);
      auVar95._0_8_ = uVar3;
      auVar95._9_6_ = auVar79._9_6_;
      auVar153._7_8_ = 0;
      auVar153._0_7_ = auVar95._8_7_;
      auVar171._1_8_ = SUB158(auVar153 << 0x40,7);
      auVar171[0] = (char)(uVar3 >> 0x18);
      auVar171._9_6_ = 0;
      auVar172._1_10_ = SUB1510(auVar171 << 0x30,5);
      auVar172[0] = (char)(uVar3 >> 0x10);
      auVar172._11_4_ = 0;
      auVar260._3_12_ = SUB1512(auVar172 << 0x20,3);
      auVar260[2] = (char)(uVar3 >> 8);
      auVar260[0] = (byte)uVar3;
      auVar260[1] = 0;
      auVar260[0xf] = 0;
      auVar139._4_4_ = uVar129;
      auVar139._0_4_ = uVar129;
      auVar139._8_4_ = uVar129;
      auVar139._12_4_ = uVar129;
      auVar261 = pmaddwd(auVar260,auVar139);
      auVar17._8_6_ = 0;
      auVar17._0_8_ = uVar4;
      auVar17[0xe] = uVar241;
      auVar32._8_4_ = 0;
      auVar32._0_8_ = uVar4;
      auVar32[0xc] = uVar284;
      auVar32._13_2_ = auVar17._13_2_;
      auVar48._8_4_ = 0;
      auVar48._0_8_ = uVar4;
      auVar48._12_3_ = auVar32._12_3_;
      auVar64._8_2_ = 0;
      auVar64._0_8_ = uVar4;
      auVar64[10] = uVar240;
      auVar64._11_4_ = auVar48._11_4_;
      auVar80._8_2_ = 0;
      auVar80._0_8_ = uVar4;
      auVar80._10_5_ = auVar64._10_5_;
      auVar96[8] = uVar283;
      auVar96._0_8_ = uVar4;
      auVar96._9_6_ = auVar80._9_6_;
      auVar154._7_8_ = 0;
      auVar154._0_7_ = auVar96._8_7_;
      auVar173._1_8_ = SUB158(auVar154 << 0x40,7);
      auVar173[0] = uVar239;
      auVar173._9_6_ = 0;
      auVar174._1_10_ = SUB1510(auVar173 << 0x30,5);
      auVar174[0] = uVar282;
      auVar174._11_4_ = 0;
      auVar112[2] = bVar285;
      auVar112._0_2_ = uVar344;
      auVar112._3_12_ = SUB1512(auVar174 << 0x20,3);
      auVar218[1] = 0;
      auVar218[0] = (byte)uVar13;
      auVar218._2_13_ = auVar112._2_13_;
      auVar218[0xf] = 0;
      auVar135._4_4_ = uVar130;
      auVar135._0_4_ = uVar130;
      auVar135._8_4_ = uVar130;
      auVar135._12_4_ = uVar130;
      auVar243 = pmaddwd(auVar218,auVar135);
      auVar219._0_4_ =
           (auVar243._0_4_ + auVar261._0_4_ + auVar245._0_4_ + auVar235._0_4_ << iVar205) + iVar234
           >> auVar287;
      auVar219._4_4_ =
           auVar243._4_4_ + auVar261._4_4_ + auVar245._4_4_ + auVar235._4_4_ + iVar234 >> auVar287;
      auVar219._8_4_ =
           auVar243._8_4_ + auVar261._8_4_ + auVar245._8_4_ + auVar235._8_4_ + iVar234 >> auVar287;
      auVar219._12_4_ =
           auVar243._12_4_ + auVar261._12_4_ + auVar245._12_4_ + auVar235._12_4_ + iVar234 >>
           auVar287;
      uVar13 = *(undefined4 *)(puVar211 + lVar214 * 8);
      auVar235 = packssdw(auVar219,auVar219);
      sVar216 = auVar235._0_2_ + sVar242;
      sVar226 = auVar235._2_2_ + sVar259;
      sVar227 = auVar235._4_2_ + sVar242;
      sVar228 = auVar235._6_2_ + sVar259;
      sVar229 = auVar235._8_2_ + sVar242;
      sVar230 = auVar235._10_2_ + sVar259;
      sVar231 = auVar235._12_2_ + sVar242;
      sVar232 = auVar235._14_2_ + sVar259;
      if (iVar209 == 0) {
        *(short *)*pauVar202 = sVar216;
        *(short *)(*pauVar202 + 2) = sVar226;
        *(short *)(*pauVar202 + 4) = sVar227;
        *(short *)(*pauVar202 + 6) = sVar228;
        *(short *)(*pauVar202 + 8) = sVar229;
        *(short *)(*pauVar202 + 10) = sVar230;
        *(short *)(*pauVar202 + 0xc) = sVar231;
        *(short *)(*pauVar202 + 0xe) = sVar232;
      }
      else {
        auVar235 = *pauVar202;
        if (iVar6 == 0) {
          auVar290._0_2_ = auVar235._0_2_ + sVar216;
          auVar290._2_2_ = auVar235._2_2_ + sVar226;
          auVar290._4_2_ = auVar235._4_2_ + sVar227;
          auVar290._6_2_ = auVar235._6_2_ + sVar228;
          auVar290._8_2_ = auVar235._8_2_ + sVar229;
          auVar290._10_2_ = auVar235._10_2_ + sVar230;
          auVar290._12_2_ = auVar235._12_2_ + sVar231;
          auVar290._14_2_ = auVar235._14_2_ + sVar232;
          auVar235 = psraw(auVar290,1);
        }
        else {
          auVar249._0_12_ = auVar235._0_12_;
          auVar249._12_2_ = auVar235._6_2_;
          auVar249._14_2_ = sVar228;
          auVar248._12_4_ = auVar249._12_4_;
          auVar248._0_10_ = auVar235._0_10_;
          auVar248._10_2_ = sVar227;
          auVar247._10_6_ = auVar248._10_6_;
          auVar247._0_8_ = auVar235._0_8_;
          auVar247._8_2_ = auVar235._4_2_;
          auVar246._8_8_ = auVar247._8_8_;
          auVar246._6_2_ = sVar226;
          auVar246._4_2_ = auVar235._2_2_;
          auVar246._2_2_ = sVar216;
          auVar246._0_2_ = auVar235._0_2_;
          auVar288._2_2_ = sVar229;
          auVar288._0_2_ = auVar235._8_2_;
          auVar288._4_2_ = auVar235._10_2_;
          auVar288._6_2_ = sVar230;
          auVar288._8_2_ = auVar235._12_2_;
          auVar288._10_2_ = sVar231;
          auVar288._12_2_ = auVar235._14_2_;
          auVar288._14_2_ = sVar232;
          auVar131._4_4_ = uVar233;
          auVar131._0_4_ = uVar233;
          auVar131._8_4_ = uVar233;
          auVar131._12_4_ = uVar233;
          auVar235 = pmaddwd(auVar246,auVar131);
          auVar243 = pmaddwd(auVar288,auVar131);
          auVar250._0_4_ = auVar235._0_4_ >> 4;
          auVar250._4_4_ = auVar235._4_4_ >> 4;
          auVar250._8_4_ = auVar235._8_4_ >> 4;
          auVar250._12_4_ = auVar235._12_4_ >> 4;
          auVar289._0_4_ = auVar243._0_4_ >> 4;
          auVar289._4_4_ = auVar243._4_4_ >> 4;
          auVar289._8_4_ = auVar243._8_4_ >> 4;
          auVar289._12_4_ = auVar243._12_4_ >> 4;
          auVar235 = packssdw(auVar250,auVar289);
        }
        auVar251._0_2_ = auVar235._0_2_ + (sVar324 - sVar242);
        auVar251._2_2_ = auVar235._2_2_ + (sVar325 - sVar259);
        auVar251._4_2_ = auVar235._4_2_ + (sVar324 - sVar242);
        auVar251._6_2_ = auVar235._6_2_ + (sVar325 - sVar259);
        auVar251._8_2_ = auVar235._8_2_ + (sVar324 - sVar242);
        auVar251._10_2_ = auVar235._10_2_ + (sVar325 - sVar259);
        auVar251._12_2_ = auVar235._12_2_ + (sVar324 - sVar242);
        auVar251._14_2_ = auVar235._14_2_ + (sVar325 - sVar259);
        auVar235 = psraw(auVar251,ZEXT416(uVar200));
        sVar216 = auVar235._0_2_;
        sVar226 = auVar235._2_2_;
        sVar227 = auVar235._4_2_;
        sVar228 = auVar235._6_2_;
        *(uint *)dst0 =
             CONCAT13((0 < sVar228) * (sVar228 < 0x100) * auVar235[6] - (0xff < sVar228),
                      CONCAT12((0 < sVar227) * (sVar227 < 0x100) * auVar235[4] - (0xff < sVar227),
                               CONCAT11((0 < sVar226) * (sVar226 < 0x100) * auVar235[2] -
                                        (0xff < sVar226),
                                        (0 < sVar216) * (sVar216 < 0x100) * auVar235[0] -
                                        (0xff < sVar216))));
      }
      uVar284 = (undefined1)((uint)uVar13 >> 0x18);
      uVar283 = (undefined1)((uint)uVar13 >> 0x10);
      uVar282 = (undefined1)((uint)uVar13 >> 8);
      uVar344 = CONCAT11((char)uVar13,bVar285);
      uVar5 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar284,uVar241),uVar283),
                                                        CONCAT14(uVar240,uVar7)) >> 0x20),uVar282),
                                uVar239),uVar344);
      auVar18._8_6_ = 0;
      auVar18._0_8_ = uVar126;
      auVar18[0xe] = (char)(uVar126 >> 0x38);
      auVar33._8_4_ = 0;
      auVar33._0_8_ = uVar126;
      auVar33[0xc] = (char)(uVar126 >> 0x30);
      auVar33._13_2_ = auVar18._13_2_;
      auVar49._8_4_ = 0;
      auVar49._0_8_ = uVar126;
      auVar49._12_3_ = auVar33._12_3_;
      auVar65._8_2_ = 0;
      auVar65._0_8_ = uVar126;
      auVar65[10] = (char)(uVar126 >> 0x28);
      auVar65._11_4_ = auVar49._11_4_;
      auVar81._8_2_ = 0;
      auVar81._0_8_ = uVar126;
      auVar81._10_5_ = auVar65._10_5_;
      auVar97[8] = (char)(uVar126 >> 0x20);
      auVar97._0_8_ = uVar126;
      auVar97._9_6_ = auVar81._9_6_;
      auVar155._7_8_ = 0;
      auVar155._0_7_ = auVar97._8_7_;
      auVar175._1_8_ = SUB158(auVar155 << 0x40,7);
      auVar175[0] = (char)(uVar126 >> 0x18);
      auVar175._9_6_ = 0;
      auVar176._1_10_ = SUB1510(auVar175 << 0x30,5);
      auVar176[0] = (char)(uVar126 >> 0x10);
      auVar176._11_4_ = 0;
      auVar113[2] = (char)(uVar126 >> 8);
      auVar113._0_2_ = (ushort)uVar126;
      auVar113._3_12_ = SUB1512(auVar176 << 0x20,3);
      auVar359._0_2_ = (ushort)uVar126 & 0xff;
      auVar359._2_13_ = auVar113._2_13_;
      auVar359[0xf] = 0;
      auVar19._8_6_ = 0;
      auVar19._0_8_ = uVar124;
      auVar19[0xe] = (char)(uVar124 >> 0x38);
      auVar34._8_4_ = 0;
      auVar34._0_8_ = uVar124;
      auVar34[0xc] = (char)(uVar124 >> 0x30);
      auVar34._13_2_ = auVar19._13_2_;
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar124;
      auVar50._12_3_ = auVar34._12_3_;
      auVar66._8_2_ = 0;
      auVar66._0_8_ = uVar124;
      auVar66[10] = (char)(uVar124 >> 0x28);
      auVar66._11_4_ = auVar50._11_4_;
      auVar82._8_2_ = 0;
      auVar82._0_8_ = uVar124;
      auVar82._10_5_ = auVar66._10_5_;
      auVar98[8] = (char)(uVar124 >> 0x20);
      auVar98._0_8_ = uVar124;
      auVar98._9_6_ = auVar82._9_6_;
      auVar156._7_8_ = 0;
      auVar156._0_7_ = auVar98._8_7_;
      auVar177._1_8_ = SUB158(auVar156 << 0x40,7);
      auVar177[0] = (char)(uVar124 >> 0x18);
      auVar177._9_6_ = 0;
      auVar178._1_10_ = SUB1510(auVar177 << 0x30,5);
      auVar178[0] = (char)(uVar124 >> 0x10);
      auVar178._11_4_ = 0;
      auVar114[2] = (char)(uVar124 >> 8);
      auVar114._0_2_ = (ushort)uVar124;
      auVar114._3_12_ = SUB1512(auVar178 << 0x20,3);
      auVar220._0_2_ = (ushort)uVar124 & 0xff;
      auVar220._2_13_ = auVar114._2_13_;
      auVar220[0xf] = 0;
      auVar148._4_4_ = uVar127;
      auVar148._0_4_ = uVar127;
      auVar148._8_4_ = uVar127;
      auVar148._12_4_ = uVar127;
      auVar261 = pmaddwd(auVar359,auVar148);
      auVar144._4_4_ = uVar128;
      auVar144._0_4_ = uVar128;
      auVar144._8_4_ = uVar128;
      auVar144._12_4_ = uVar128;
      auVar235 = pmaddwd(auVar220,auVar144);
      auVar20._8_6_ = 0;
      auVar20._0_8_ = uVar199;
      auVar20[0xe] = (char)(uVar199 >> 0x38);
      auVar35._8_4_ = 0;
      auVar35._0_8_ = uVar199;
      auVar35[0xc] = (char)(uVar199 >> 0x30);
      auVar35._13_2_ = auVar20._13_2_;
      auVar51._8_4_ = 0;
      auVar51._0_8_ = uVar199;
      auVar51._12_3_ = auVar35._12_3_;
      auVar67._8_2_ = 0;
      auVar67._0_8_ = uVar199;
      auVar67[10] = (char)(uVar199 >> 0x28);
      auVar67._11_4_ = auVar51._11_4_;
      auVar83._8_2_ = 0;
      auVar83._0_8_ = uVar199;
      auVar83._10_5_ = auVar67._10_5_;
      auVar99[8] = (char)(uVar199 >> 0x20);
      auVar99._0_8_ = uVar199;
      auVar99._9_6_ = auVar83._9_6_;
      auVar157._7_8_ = 0;
      auVar157._0_7_ = auVar99._8_7_;
      auVar179._1_8_ = SUB158(auVar157 << 0x40,7);
      auVar179[0] = (char)(uVar199 >> 0x18);
      auVar179._9_6_ = 0;
      auVar180._1_10_ = SUB1510(auVar179 << 0x30,5);
      auVar180[0] = (char)(uVar199 >> 0x10);
      auVar180._11_4_ = 0;
      auVar115[2] = (char)(uVar199 >> 8);
      auVar115._0_2_ = (ushort)uVar199;
      auVar115._3_12_ = SUB1512(auVar180 << 0x20,3);
      auVar252._0_2_ = (ushort)uVar199 & 0xff;
      auVar252._2_13_ = auVar115._2_13_;
      auVar252[0xf] = 0;
      auVar140._4_4_ = uVar129;
      auVar140._0_4_ = uVar129;
      auVar140._8_4_ = uVar129;
      auVar140._12_4_ = uVar129;
      auVar245 = pmaddwd(auVar252,auVar140);
      auVar21._8_6_ = 0;
      auVar21._0_8_ = uVar5;
      auVar21[0xe] = uVar284;
      auVar36._8_4_ = 0;
      auVar36._0_8_ = uVar5;
      auVar36[0xc] = uVar241;
      auVar36._13_2_ = auVar21._13_2_;
      auVar52._8_4_ = 0;
      auVar52._0_8_ = uVar5;
      auVar52._12_3_ = auVar36._12_3_;
      auVar68._8_2_ = 0;
      auVar68._0_8_ = uVar5;
      auVar68[10] = uVar283;
      auVar68._11_4_ = auVar52._11_4_;
      auVar84._8_2_ = 0;
      auVar84._0_8_ = uVar5;
      auVar84._10_5_ = auVar68._10_5_;
      auVar100[8] = uVar240;
      auVar100._0_8_ = uVar5;
      auVar100._9_6_ = auVar84._9_6_;
      auVar158._7_8_ = 0;
      auVar158._0_7_ = auVar100._8_7_;
      auVar181._1_8_ = SUB158(auVar158 << 0x40,7);
      auVar181[0] = uVar282;
      auVar181._9_6_ = 0;
      auVar182._1_10_ = SUB1510(auVar181 << 0x30,5);
      auVar182[0] = uVar239;
      auVar182._11_4_ = 0;
      auVar116[2] = (char)uVar13;
      auVar116._0_2_ = uVar344;
      auVar116._3_12_ = SUB1512(auVar182 << 0x20,3);
      auVar221[1] = 0;
      auVar221[0] = bVar285;
      auVar221._2_13_ = auVar116._2_13_;
      auVar221[0xf] = 0;
      auVar136._4_4_ = uVar130;
      auVar136._0_4_ = uVar130;
      auVar136._8_4_ = uVar130;
      auVar136._12_4_ = uVar130;
      auVar243 = pmaddwd(auVar221,auVar136);
      auVar222._0_4_ =
           (auVar243._0_4_ + auVar245._0_4_ + auVar235._0_4_ + auVar261._0_4_ << iVar205) + iVar234
           >> auVar287;
      auVar222._4_4_ =
           auVar243._4_4_ + auVar245._4_4_ + auVar235._4_4_ + auVar261._4_4_ + iVar234 >> auVar287;
      auVar222._8_4_ =
           auVar243._8_4_ + auVar245._8_4_ + auVar235._8_4_ + auVar261._8_4_ + iVar234 >> auVar287;
      auVar222._12_4_ =
           auVar243._12_4_ + auVar245._12_4_ + auVar235._12_4_ + auVar261._12_4_ + iVar234 >>
           auVar287;
      auVar235 = packssdw(auVar222,auVar222);
      sVar216 = auVar235._0_2_ + sVar242;
      sVar226 = auVar235._2_2_ + sVar259;
      sVar227 = auVar235._4_2_ + sVar242;
      sVar228 = auVar235._6_2_ + sVar259;
      sVar229 = auVar235._8_2_ + sVar242;
      sVar230 = auVar235._10_2_ + sVar259;
      sVar231 = auVar235._12_2_ + sVar242;
      sVar232 = auVar235._14_2_ + sVar259;
      if (iVar209 == 0) {
        psVar2 = (short *)(*pauVar202 + lVar213 * 2);
        *psVar2 = sVar216;
        psVar2[1] = sVar226;
        psVar2[2] = sVar227;
        psVar2[3] = sVar228;
        psVar2[4] = sVar229;
        psVar2[5] = sVar230;
        psVar2[6] = sVar231;
        psVar2[7] = sVar232;
      }
      else {
        auVar235 = *(undefined1 (*) [16])(*pauVar202 + lVar213 * 2);
        if (iVar6 == 0) {
          auVar293._0_2_ = auVar235._0_2_ + sVar216;
          auVar293._2_2_ = auVar235._2_2_ + sVar226;
          auVar293._4_2_ = auVar235._4_2_ + sVar227;
          auVar293._6_2_ = auVar235._6_2_ + sVar228;
          auVar293._8_2_ = auVar235._8_2_ + sVar229;
          auVar293._10_2_ = auVar235._10_2_ + sVar230;
          auVar293._12_2_ = auVar235._12_2_ + sVar231;
          auVar293._14_2_ = auVar235._14_2_ + sVar232;
          auVar235 = psraw(auVar293,1);
        }
        else {
          auVar256._0_12_ = auVar235._0_12_;
          auVar256._12_2_ = auVar235._6_2_;
          auVar256._14_2_ = sVar228;
          auVar255._12_4_ = auVar256._12_4_;
          auVar255._0_10_ = auVar235._0_10_;
          auVar255._10_2_ = sVar227;
          auVar254._10_6_ = auVar255._10_6_;
          auVar254._0_8_ = auVar235._0_8_;
          auVar254._8_2_ = auVar235._4_2_;
          auVar253._8_8_ = auVar254._8_8_;
          auVar253._6_2_ = sVar226;
          auVar253._4_2_ = auVar235._2_2_;
          auVar253._2_2_ = sVar216;
          auVar253._0_2_ = auVar235._0_2_;
          auVar291._2_2_ = sVar229;
          auVar291._0_2_ = auVar235._8_2_;
          auVar291._4_2_ = auVar235._10_2_;
          auVar291._6_2_ = sVar230;
          auVar291._8_2_ = auVar235._12_2_;
          auVar291._10_2_ = sVar231;
          auVar291._12_2_ = auVar235._14_2_;
          auVar291._14_2_ = sVar232;
          auVar132._4_4_ = uVar233;
          auVar132._0_4_ = uVar233;
          auVar132._8_4_ = uVar233;
          auVar132._12_4_ = uVar233;
          auVar235 = pmaddwd(auVar253,auVar132);
          auVar243 = pmaddwd(auVar291,auVar132);
          auVar257._0_4_ = auVar235._0_4_ >> 4;
          auVar257._4_4_ = auVar235._4_4_ >> 4;
          auVar257._8_4_ = auVar235._8_4_ >> 4;
          auVar257._12_4_ = auVar235._12_4_ >> 4;
          auVar292._0_4_ = auVar243._0_4_ >> 4;
          auVar292._4_4_ = auVar243._4_4_ >> 4;
          auVar292._8_4_ = auVar243._8_4_ >> 4;
          auVar292._12_4_ = auVar243._12_4_ >> 4;
          auVar235 = packssdw(auVar257,auVar292);
        }
        auVar258._0_2_ = auVar235._0_2_ + (sVar324 - sVar242);
        auVar258._2_2_ = auVar235._2_2_ + (sVar325 - sVar259);
        auVar258._4_2_ = auVar235._4_2_ + (sVar324 - sVar242);
        auVar258._6_2_ = auVar235._6_2_ + (sVar325 - sVar259);
        auVar258._8_2_ = auVar235._8_2_ + (sVar324 - sVar242);
        auVar258._10_2_ = auVar235._10_2_ + (sVar325 - sVar259);
        auVar258._12_2_ = auVar235._12_2_ + (sVar324 - sVar242);
        auVar258._14_2_ = auVar235._14_2_ + (sVar325 - sVar259);
        auVar235 = psraw(auVar258,ZEXT416(uVar200));
        sVar216 = auVar235._0_2_;
        sVar226 = auVar235._2_2_;
        sVar227 = auVar235._4_2_;
        sVar228 = auVar235._6_2_;
        *(uint *)(dst0 + dst_stride0) =
             CONCAT13((0 < sVar228) * (sVar228 < 0x100) * auVar235[6] - (0xff < sVar228),
                      CONCAT12((0 < sVar227) * (sVar227 < 0x100) * auVar235[4] - (0xff < sVar227),
                               CONCAT11((0 < sVar226) * (sVar226 < 0x100) * auVar235[2] -
                                        (0xff < sVar226),
                                        (0 < sVar216) * (sVar216 < 0x100) * auVar235[0] -
                                        (0xff < sVar216))));
      }
      puVar211 = puVar211 + lVar214 * 2;
      dst0 = dst0 + dst_stride0 + dst_stride0;
      pauVar202 = (undefined1 (*) [16])(*pauVar202 + lVar213 * 4);
      h = h + -2;
      uVar125 = uVar123;
      uVar126 = uVar124;
    } while (h != 0);
  }
  else {
    lVar14 = (long)dst_stride0 * 2;
    lVar210 = 0;
    do {
      uVar3 = *(ulong *)(puVar211 + lVar214 * 6 + lVar210);
      uVar4 = *(ulong *)(puVar211 + lVar210);
      uVar5 = *(ulong *)(puVar211 + lVar214 + lVar210);
      uVar284 = (undefined1)(uVar5 >> 0x38);
      auVar224._8_6_ = 0;
      auVar224._0_8_ = uVar4;
      auVar224[0xe] = (char)(uVar4 >> 0x38);
      auVar224[0xf] = uVar284;
      auVar295._14_2_ = auVar224._14_2_;
      auVar295._8_5_ = 0;
      auVar295._0_8_ = uVar4;
      uVar283 = (undefined1)(uVar5 >> 0x30);
      auVar295[0xd] = uVar283;
      auVar297._13_3_ = auVar295._13_3_;
      auVar297._8_4_ = 0;
      auVar297._0_8_ = uVar4;
      auVar297[0xc] = (char)(uVar4 >> 0x30);
      auVar238._12_4_ = auVar297._12_4_;
      auVar238._8_3_ = 0;
      auVar238._0_8_ = uVar4;
      uVar282 = (undefined1)(uVar5 >> 0x28);
      auVar238[0xb] = uVar282;
      auVar223._11_5_ = auVar238._11_5_;
      auVar223._8_2_ = 0;
      auVar223._0_8_ = uVar4;
      auVar223[10] = (char)(uVar4 >> 0x28);
      auVar341._10_6_ = auVar223._10_6_;
      auVar341[8] = 0;
      auVar341._0_8_ = uVar4;
      uVar241 = (undefined1)(uVar5 >> 0x20);
      auVar341[9] = uVar241;
      auVar329._9_7_ = auVar341._9_7_;
      auVar329[8] = (char)(uVar4 >> 0x20);
      auVar329._0_8_ = uVar4;
      auVar235._8_8_ = auVar329._8_8_;
      uVar240 = (undefined1)(uVar5 >> 0x18);
      auVar235[7] = uVar240;
      auVar235[6] = (char)(uVar4 >> 0x18);
      uVar239 = (undefined1)(uVar5 >> 0x10);
      auVar235[5] = uVar239;
      auVar235[4] = (char)(uVar4 >> 0x10);
      uVar326 = (undefined1)(uVar5 >> 8);
      auVar235[3] = uVar326;
      auVar235[2] = (char)(uVar4 >> 8);
      auVar235[0] = (undefined1)uVar4;
      auVar261[0] = (undefined1)uVar5;
      auVar235[1] = auVar261[0];
      uVar4 = *(ulong *)(puVar211 + lVar214 * 2 + lVar210);
      uVar286 = (undefined1)(uVar4 >> 0x38);
      auVar351._8_6_ = 0;
      auVar351._0_8_ = uVar5;
      auVar351[0xe] = uVar284;
      auVar351[0xf] = uVar286;
      uVar284 = (undefined1)(uVar4 >> 0x30);
      auVar350._14_2_ = auVar351._14_2_;
      auVar350._8_5_ = 0;
      auVar350._0_8_ = uVar5;
      auVar350[0xd] = uVar284;
      auVar349._13_3_ = auVar350._13_3_;
      auVar349._8_4_ = 0;
      auVar349._0_8_ = uVar5;
      auVar349[0xc] = uVar283;
      uVar283 = (undefined1)(uVar4 >> 0x28);
      auVar348._12_4_ = auVar349._12_4_;
      auVar348._8_3_ = 0;
      auVar348._0_8_ = uVar5;
      auVar348[0xb] = uVar283;
      auVar347._11_5_ = auVar348._11_5_;
      auVar347._8_2_ = 0;
      auVar347._0_8_ = uVar5;
      auVar347[10] = uVar282;
      uVar282 = (undefined1)(uVar4 >> 0x20);
      auVar346._10_6_ = auVar347._10_6_;
      auVar346[8] = 0;
      auVar346._0_8_ = uVar5;
      auVar346[9] = uVar282;
      auVar345._9_7_ = auVar346._9_7_;
      auVar345[8] = uVar241;
      auVar345._0_8_ = uVar5;
      uVar241 = (undefined1)(uVar4 >> 0x18);
      auVar261._8_8_ = auVar345._8_8_;
      auVar261[7] = uVar241;
      auVar261[6] = uVar240;
      uVar240 = (undefined1)(uVar4 >> 0x10);
      auVar261[5] = uVar240;
      auVar261[4] = uVar239;
      uVar239 = (undefined1)(uVar4 >> 8);
      auVar261[3] = uVar239;
      auVar261[2] = uVar326;
      local_148[0] = (undefined1)uVar4;
      auVar261[1] = local_148[0];
      uVar5 = *(ulong *)(puVar211 + lVar214 * 3 + lVar210);
      uVar343 = (undefined1)(uVar5 >> 0x38);
      auVar267._8_6_ = 0;
      auVar267._0_8_ = uVar4;
      auVar267[0xe] = uVar286;
      auVar267[0xf] = uVar343;
      auVar266._14_2_ = auVar267._14_2_;
      auVar266._8_5_ = 0;
      auVar266._0_8_ = uVar4;
      uVar342 = (undefined1)(uVar5 >> 0x30);
      auVar266[0xd] = uVar342;
      auVar265._13_3_ = auVar266._13_3_;
      auVar265._8_4_ = 0;
      auVar265._0_8_ = uVar4;
      auVar265[0xc] = uVar284;
      auVar264._12_4_ = auVar265._12_4_;
      auVar264._8_3_ = 0;
      auVar264._0_8_ = uVar4;
      uVar332 = (undefined1)(uVar5 >> 0x28);
      auVar264[0xb] = uVar332;
      auVar263._11_5_ = auVar264._11_5_;
      auVar263._8_2_ = 0;
      auVar263._0_8_ = uVar4;
      auVar263[10] = uVar283;
      auVar262._10_6_ = auVar263._10_6_;
      auVar262[8] = 0;
      auVar262._0_8_ = uVar4;
      uVar331 = (undefined1)(uVar5 >> 0x20);
      auVar262[9] = uVar331;
      auVar354._9_7_ = auVar262._9_7_;
      auVar354[8] = uVar282;
      auVar354._0_8_ = uVar4;
      local_148._8_8_ = auVar354._8_8_;
      uVar330 = (undefined1)(uVar5 >> 0x18);
      local_148[7] = uVar330;
      local_148[6] = uVar241;
      uVar327 = (undefined1)(uVar5 >> 0x10);
      local_148[5] = uVar327;
      local_148[4] = uVar240;
      uVar326 = (undefined1)(uVar5 >> 8);
      local_148[3] = uVar326;
      local_148[2] = uVar239;
      auVar245[0] = (undefined1)uVar5;
      local_148[1] = auVar245[0];
      uVar4 = *(ulong *)(puVar211 + lVar214 * 4 + lVar210);
      uVar286 = (undefined1)(uVar4 >> 0x38);
      auVar339._8_6_ = 0;
      auVar339._0_8_ = uVar5;
      auVar339[0xe] = uVar343;
      auVar339[0xf] = uVar286;
      uVar284 = (undefined1)(uVar4 >> 0x30);
      auVar338._14_2_ = auVar339._14_2_;
      auVar338._8_5_ = 0;
      auVar338._0_8_ = uVar5;
      auVar338[0xd] = uVar284;
      auVar337._13_3_ = auVar338._13_3_;
      auVar337._8_4_ = 0;
      auVar337._0_8_ = uVar5;
      auVar337[0xc] = uVar342;
      uVar283 = (undefined1)(uVar4 >> 0x28);
      auVar336._12_4_ = auVar337._12_4_;
      auVar336._8_3_ = 0;
      auVar336._0_8_ = uVar5;
      auVar336[0xb] = uVar283;
      auVar335._11_5_ = auVar336._11_5_;
      auVar335._8_2_ = 0;
      auVar335._0_8_ = uVar5;
      auVar335[10] = uVar332;
      uVar282 = (undefined1)(uVar4 >> 0x20);
      auVar334._10_6_ = auVar335._10_6_;
      auVar334[8] = 0;
      auVar334._0_8_ = uVar5;
      auVar334[9] = uVar282;
      auVar333._9_7_ = auVar334._9_7_;
      auVar333[8] = uVar331;
      auVar333._0_8_ = uVar5;
      uVar241 = (undefined1)(uVar4 >> 0x18);
      auVar245._8_8_ = auVar333._8_8_;
      auVar245[7] = uVar241;
      auVar245[6] = uVar330;
      uVar240 = (undefined1)(uVar4 >> 0x10);
      auVar245[5] = uVar240;
      auVar245[4] = uVar327;
      uVar239 = (undefined1)(uVar4 >> 8);
      auVar245[3] = uVar239;
      auVar245[2] = uVar326;
      auVar243[0] = (undefined1)uVar4;
      auVar245[1] = auVar243[0];
      uVar5 = *(ulong *)(puVar211 + lVar214 * 5 + lVar210);
      uVar326 = (undefined1)(uVar5 >> 0x38);
      auVar274._8_6_ = 0;
      auVar274._0_8_ = uVar4;
      auVar274[0xe] = uVar286;
      auVar274[0xf] = uVar326;
      auVar273._14_2_ = auVar274._14_2_;
      auVar273._8_5_ = 0;
      auVar273._0_8_ = uVar4;
      uVar286 = (undefined1)(uVar5 >> 0x30);
      auVar273[0xd] = uVar286;
      auVar272._13_3_ = auVar273._13_3_;
      auVar272._8_4_ = 0;
      auVar272._0_8_ = uVar4;
      auVar272[0xc] = uVar284;
      auVar271._12_4_ = auVar272._12_4_;
      auVar271._8_3_ = 0;
      auVar271._0_8_ = uVar4;
      uVar284 = (undefined1)(uVar5 >> 0x28);
      auVar271[0xb] = uVar284;
      auVar270._11_5_ = auVar271._11_5_;
      auVar270._8_2_ = 0;
      auVar270._0_8_ = uVar4;
      auVar270[10] = uVar283;
      auVar269._10_6_ = auVar270._10_6_;
      auVar269[8] = 0;
      auVar269._0_8_ = uVar4;
      uVar283 = (undefined1)(uVar5 >> 0x20);
      auVar269[9] = uVar283;
      auVar268._9_7_ = auVar269._9_7_;
      auVar268[8] = uVar282;
      auVar268._0_8_ = uVar4;
      auVar243._8_8_ = auVar268._8_8_;
      uVar282 = (undefined1)(uVar5 >> 0x18);
      auVar243[7] = uVar282;
      auVar243[6] = uVar241;
      uVar241 = (undefined1)(uVar5 >> 0x10);
      auVar243[5] = uVar241;
      auVar243[4] = uVar240;
      uVar240 = (undefined1)(uVar5 >> 8);
      auVar243[3] = uVar240;
      auVar243[2] = uVar239;
      auVar360[0] = (undefined1)uVar5;
      auVar243[1] = auVar360[0];
      auVar367._8_6_ = 0;
      auVar367._0_8_ = uVar5;
      auVar367[0xe] = uVar326;
      auVar367[0xf] = (char)(uVar3 >> 0x38);
      auVar366._14_2_ = auVar367._14_2_;
      auVar366._8_5_ = 0;
      auVar366._0_8_ = uVar5;
      auVar366[0xd] = (char)(uVar3 >> 0x30);
      auVar365._13_3_ = auVar366._13_3_;
      auVar365._8_4_ = 0;
      auVar365._0_8_ = uVar5;
      auVar365[0xc] = uVar286;
      auVar364._12_4_ = auVar365._12_4_;
      auVar364._8_3_ = 0;
      auVar364._0_8_ = uVar5;
      auVar364[0xb] = (char)(uVar3 >> 0x28);
      auVar363._11_5_ = auVar364._11_5_;
      auVar363._8_2_ = 0;
      auVar363._0_8_ = uVar5;
      auVar363[10] = uVar284;
      auVar362._10_6_ = auVar363._10_6_;
      auVar362[8] = 0;
      auVar362._0_8_ = uVar5;
      auVar362[9] = (char)(uVar3 >> 0x20);
      auVar361._9_7_ = auVar362._9_7_;
      auVar361[8] = uVar283;
      auVar361._0_8_ = uVar5;
      auVar360._8_8_ = auVar361._8_8_;
      auVar360[7] = (char)(uVar3 >> 0x18);
      auVar360[6] = uVar282;
      auVar360[5] = (char)(uVar3 >> 0x10);
      auVar360[4] = uVar241;
      auVar360[3] = (char)(uVar3 >> 8);
      auVar360[2] = uVar240;
      auVar360[1] = (char)uVar3;
      lVar215 = 0;
      puVar201 = dst0;
      pauVar203 = pauVar202;
      puVar204 = dst0 + dst_stride0;
      puVar207 = src + (src_stride * 7 - lVar206);
      puVar212 = src + (src_stride * 8 - lVar206);
      do {
        auVar223 = auVar245;
        auVar224 = auVar243;
        uVar4 = *(ulong *)(puVar207 + lVar210);
        uVar342 = (undefined1)(uVar4 >> 0x38);
        uVar284 = (undefined1)(uVar3 >> 0x38);
        auVar281._8_6_ = 0;
        auVar281._0_8_ = uVar3;
        auVar281[0xe] = uVar284;
        auVar281[0xf] = uVar342;
        auVar280._14_2_ = auVar281._14_2_;
        auVar280._8_5_ = 0;
        auVar280._0_8_ = uVar3;
        uVar332 = (undefined1)(uVar4 >> 0x30);
        auVar280[0xd] = uVar332;
        uVar283 = (undefined1)(uVar3 >> 0x30);
        auVar279._13_3_ = auVar280._13_3_;
        auVar279._8_4_ = 0;
        auVar279._0_8_ = uVar3;
        auVar279[0xc] = uVar283;
        auVar278._12_4_ = auVar279._12_4_;
        auVar278._8_3_ = 0;
        auVar278._0_8_ = uVar3;
        uVar331 = (undefined1)(uVar4 >> 0x28);
        auVar278[0xb] = uVar331;
        uVar282 = (undefined1)(uVar3 >> 0x28);
        auVar277._11_5_ = auVar278._11_5_;
        auVar277._8_2_ = 0;
        auVar277._0_8_ = uVar3;
        auVar277[10] = uVar282;
        auVar276._10_6_ = auVar277._10_6_;
        auVar276[8] = 0;
        auVar276._0_8_ = uVar3;
        bVar377 = (byte)(uVar4 >> 0x20);
        auVar276[9] = bVar377;
        bVar285 = (byte)(uVar3 >> 0x20);
        auVar275._9_7_ = auVar276._9_7_;
        auVar275[8] = bVar285;
        auVar275._0_8_ = uVar3;
        auVar243._8_8_ = auVar275._8_8_;
        uVar330 = (undefined1)(uVar4 >> 0x18);
        auVar243[7] = uVar330;
        uVar241 = (undefined1)(uVar3 >> 0x18);
        auVar243[6] = uVar241;
        uVar327 = (undefined1)(uVar4 >> 0x10);
        auVar243[5] = uVar327;
        uVar240 = (undefined1)(uVar3 >> 0x10);
        auVar243[4] = uVar240;
        uVar326 = (undefined1)(uVar4 >> 8);
        auVar243[3] = uVar326;
        uVar239 = (undefined1)(uVar3 >> 8);
        auVar243[2] = uVar239;
        bVar358 = (byte)uVar4;
        auVar243._0_2_ = CONCAT11(bVar358,(byte)uVar3);
        auVar37[0xd] = 0;
        auVar37._0_13_ = auVar235._0_13_;
        auVar37[0xe] = auVar235[7];
        auVar53[0xc] = auVar235[6];
        auVar53._0_12_ = auVar235._0_12_;
        auVar53._13_2_ = auVar37._13_2_;
        auVar69[0xb] = 0;
        auVar69._0_11_ = auVar235._0_11_;
        auVar69._12_3_ = auVar53._12_3_;
        auVar85[10] = auVar235[5];
        auVar85._0_10_ = auVar235._0_10_;
        auVar85._11_4_ = auVar69._11_4_;
        auVar101[9] = 0;
        auVar101._0_9_ = auVar235._0_9_;
        auVar101._10_5_ = auVar85._10_5_;
        auVar110[8] = auVar235[4];
        auVar110._0_8_ = auVar235._0_8_;
        auVar110._9_6_ = auVar101._9_6_;
        auVar159._7_8_ = 0;
        auVar159._0_7_ = auVar110._8_7_;
        auVar183._1_8_ = SUB158(auVar159 << 0x40,7);
        auVar183[0] = auVar235[3];
        auVar183._9_6_ = 0;
        auVar184._1_10_ = SUB1510(auVar183 << 0x30,5);
        auVar184[0] = auVar235[2];
        auVar184._11_4_ = 0;
        auVar236._3_12_ = SUB1512(auVar184 << 0x20,3);
        auVar236[2] = auVar235[1];
        auVar236[0] = auVar235[0];
        auVar236[1] = 0;
        auVar236[0xf] = 0;
        auVar22[0xd] = 0;
        auVar22._0_13_ = local_148._0_13_;
        auVar22[0xe] = local_148[7];
        auVar38[0xc] = local_148[6];
        auVar38._0_12_ = local_148._0_12_;
        auVar38._13_2_ = auVar22._13_2_;
        auVar54[0xb] = 0;
        auVar54._0_11_ = local_148._0_11_;
        auVar54._12_3_ = auVar38._12_3_;
        auVar70[10] = local_148[5];
        auVar70._0_10_ = local_148._0_10_;
        auVar70._11_4_ = auVar54._11_4_;
        auVar86[9] = 0;
        auVar86._0_9_ = local_148._0_9_;
        auVar86._10_5_ = auVar70._10_5_;
        auVar102[8] = local_148[4];
        auVar102._0_8_ = local_148._0_8_;
        auVar102._9_6_ = auVar86._9_6_;
        auVar160._7_8_ = 0;
        auVar160._0_7_ = auVar102._8_7_;
        auVar185._1_8_ = SUB158(auVar160 << 0x40,7);
        auVar185[0] = local_148[3];
        auVar185._9_6_ = 0;
        auVar186._1_10_ = SUB1510(auVar185 << 0x30,5);
        auVar186[0] = local_148[2];
        auVar186._11_4_ = 0;
        auVar117[2] = local_148[1];
        auVar117._0_2_ = local_148._0_2_;
        auVar117._3_12_ = SUB1512(auVar186 << 0x20,3);
        auVar294._0_2_ = local_148._0_2_ & 0xff;
        auVar294._2_13_ = auVar117._2_13_;
        auVar294[0xf] = 0;
        auVar149._4_4_ = uVar127;
        auVar149._0_4_ = uVar127;
        auVar149._8_4_ = uVar127;
        auVar149._12_4_ = uVar127;
        auVar245 = pmaddwd(auVar236,auVar149);
        auVar145._4_4_ = uVar128;
        auVar145._0_4_ = uVar128;
        auVar145._8_4_ = uVar128;
        auVar145._12_4_ = uVar128;
        auVar295 = pmaddwd(auVar294,auVar145);
        auVar23[0xd] = 0;
        auVar23._0_13_ = auVar224._0_13_;
        auVar23[0xe] = auVar224[7];
        auVar39[0xc] = auVar224[6];
        auVar39._0_12_ = auVar224._0_12_;
        auVar39._13_2_ = auVar23._13_2_;
        auVar55[0xb] = 0;
        auVar55._0_11_ = auVar224._0_11_;
        auVar55._12_3_ = auVar39._12_3_;
        auVar71[10] = auVar224[5];
        auVar71._0_10_ = auVar224._0_10_;
        auVar71._11_4_ = auVar55._11_4_;
        auVar87[9] = 0;
        auVar87._0_9_ = auVar224._0_9_;
        auVar87._10_5_ = auVar71._10_5_;
        auVar103[8] = auVar224[4];
        auVar103._0_8_ = auVar224._0_8_;
        auVar103._9_6_ = auVar87._9_6_;
        auVar161._7_8_ = 0;
        auVar161._0_7_ = auVar103._8_7_;
        auVar187._1_8_ = SUB158(auVar161 << 0x40,7);
        auVar187[0] = auVar224[3];
        auVar187._9_6_ = 0;
        auVar188._1_10_ = SUB1510(auVar187 << 0x30,5);
        auVar188[0] = auVar224[2];
        auVar188._11_4_ = 0;
        auVar237._3_12_ = SUB1512(auVar188 << 0x20,3);
        auVar237[2] = auVar224[1];
        auVar237[0] = auVar224[0];
        auVar237[1] = 0;
        auVar237[0xf] = 0;
        auVar141._4_4_ = uVar129;
        auVar141._0_4_ = uVar129;
        auVar141._8_4_ = uVar129;
        auVar141._12_4_ = uVar129;
        auVar238 = pmaddwd(auVar237,auVar141);
        auVar24[0xd] = 0;
        auVar24._0_13_ = auVar243._0_13_;
        auVar24[0xe] = uVar330;
        auVar40[0xc] = uVar241;
        auVar40._0_12_ = auVar243._0_12_;
        auVar40._13_2_ = auVar24._13_2_;
        auVar56[0xb] = 0;
        auVar56._0_11_ = auVar243._0_11_;
        auVar56._12_3_ = auVar40._12_3_;
        auVar72[10] = uVar327;
        auVar72._0_10_ = auVar243._0_10_;
        auVar72._11_4_ = auVar56._11_4_;
        auVar88[9] = 0;
        auVar88._0_9_ = auVar243._0_9_;
        auVar88._10_5_ = auVar72._10_5_;
        auVar104[8] = uVar240;
        auVar104._0_8_ = auVar243._0_8_;
        auVar104._9_6_ = auVar88._9_6_;
        auVar162._7_8_ = 0;
        auVar162._0_7_ = auVar104._8_7_;
        auVar189._1_8_ = SUB158(auVar162 << 0x40,7);
        auVar189[0] = uVar326;
        auVar189._9_6_ = 0;
        auVar190._1_10_ = SUB1510(auVar189 << 0x30,5);
        auVar190[0] = uVar239;
        auVar190._11_4_ = 0;
        auVar118[2] = bVar358;
        auVar118._0_2_ = auVar243._0_2_;
        auVar118._3_12_ = SUB1512(auVar190 << 0x20,3);
        auVar353[1] = 0;
        auVar353[0] = (byte)uVar3;
        auVar353._2_13_ = auVar118._2_13_;
        auVar353[0xf] = 0;
        auVar137._4_4_ = uVar130;
        auVar137._0_4_ = uVar130;
        auVar137._8_4_ = uVar130;
        auVar137._12_4_ = uVar130;
        auVar354 = pmaddwd(auVar353,auVar137);
        auVar225[1] = 0;
        auVar225[0] = auVar235[8];
        auVar225[2] = auVar235[9];
        auVar225[3] = 0;
        auVar225[4] = auVar235[10];
        auVar225[5] = 0;
        auVar225[6] = auVar235[0xb];
        auVar225[7] = 0;
        auVar225[8] = auVar235[0xc];
        auVar225[9] = 0;
        auVar225[10] = auVar235[0xd];
        auVar225[0xb] = 0;
        auVar225[0xc] = auVar235[0xe];
        auVar225[0xd] = 0;
        auVar225[0xe] = auVar235[0xf];
        auVar225[0xf] = 0;
        auVar328[1] = 0;
        auVar328[0] = local_148[8];
        auVar328[2] = local_148[9];
        auVar328[3] = 0;
        auVar328[4] = local_148[10];
        auVar328[5] = 0;
        auVar328[6] = local_148[0xb];
        auVar328[7] = 0;
        auVar328[8] = local_148[0xc];
        auVar328[9] = 0;
        auVar328[10] = local_148[0xd];
        auVar328[0xb] = 0;
        auVar328[0xc] = local_148[0xe];
        auVar328[0xd] = 0;
        auVar328[0xe] = local_148[0xf];
        auVar328[0xf] = 0;
        auVar235 = pmaddwd(auVar225,auVar149);
        auVar329 = pmaddwd(auVar328,auVar145);
        auVar340[1] = 0;
        auVar340[0] = auVar224[8];
        auVar340[2] = auVar224[9];
        auVar340[3] = 0;
        auVar340[4] = auVar224[10];
        auVar340[5] = 0;
        auVar340[6] = auVar224[0xb];
        auVar340[7] = 0;
        auVar340[8] = auVar224[0xc];
        auVar340[9] = 0;
        auVar340[10] = auVar224[0xd];
        auVar340[0xb] = 0;
        auVar340[0xc] = auVar224[0xe];
        auVar340[0xd] = 0;
        auVar340[0xe] = auVar224[0xf];
        auVar340[0xf] = 0;
        auVar341 = pmaddwd(auVar340,auVar141);
        auVar296[1] = 0;
        auVar296[0] = bVar285;
        auVar296[2] = bVar377;
        auVar296[3] = 0;
        auVar296[4] = uVar282;
        auVar296[5] = 0;
        auVar296[6] = uVar331;
        auVar296[7] = 0;
        auVar296[8] = uVar283;
        auVar296[9] = 0;
        auVar296[10] = uVar332;
        auVar296[0xb] = 0;
        auVar296[0xc] = uVar284;
        auVar296[0xd] = 0;
        auVar296[0xe] = uVar342;
        auVar296[0xf] = 0;
        auVar297 = pmaddwd(auVar296,auVar137);
        uVar3 = *(ulong *)(puVar212 + lVar210);
        auVar355._0_4_ =
             (auVar354._0_4_ + auVar238._0_4_ + auVar295._0_4_ + auVar245._0_4_ << iVar205) +
             iVar234 >> auVar287;
        auVar355._4_4_ =
             auVar354._4_4_ + auVar238._4_4_ + auVar295._4_4_ + auVar245._4_4_ + iVar234 >> auVar287
        ;
        auVar355._8_4_ =
             auVar354._8_4_ + auVar238._8_4_ + auVar295._8_4_ + auVar245._8_4_ + iVar234 >> auVar287
        ;
        auVar355._12_4_ =
             auVar354._12_4_ + auVar238._12_4_ + auVar295._12_4_ + auVar245._12_4_ + iVar234 >>
             auVar287;
        uVar286 = (undefined1)(uVar3 >> 0x38);
        auVar375._8_6_ = 0;
        auVar375._0_8_ = uVar4;
        auVar375[0xe] = uVar342;
        auVar375[0xf] = uVar286;
        uVar284 = (undefined1)(uVar3 >> 0x30);
        auVar374._14_2_ = auVar375._14_2_;
        auVar374._8_5_ = 0;
        auVar374._0_8_ = uVar4;
        auVar374[0xd] = uVar284;
        auVar373._13_3_ = auVar374._13_3_;
        auVar373._8_4_ = 0;
        auVar373._0_8_ = uVar4;
        auVar373[0xc] = uVar332;
        uVar283 = (undefined1)(uVar3 >> 0x28);
        auVar372._12_4_ = auVar373._12_4_;
        auVar372._8_3_ = 0;
        auVar372._0_8_ = uVar4;
        auVar372[0xb] = uVar283;
        auVar371._11_5_ = auVar372._11_5_;
        auVar371._8_2_ = 0;
        auVar371._0_8_ = uVar4;
        auVar371[10] = uVar331;
        uVar282 = (undefined1)(uVar3 >> 0x20);
        auVar370._10_6_ = auVar371._10_6_;
        auVar370[8] = 0;
        auVar370._0_8_ = uVar4;
        auVar370[9] = uVar282;
        auVar369._9_7_ = auVar370._9_7_;
        auVar369[8] = bVar377;
        auVar369._0_8_ = uVar4;
        uVar241 = (undefined1)(uVar3 >> 0x18);
        auVar368._8_8_ = auVar369._8_8_;
        auVar368[7] = uVar241;
        auVar368[6] = uVar330;
        uVar240 = (undefined1)(uVar3 >> 0x10);
        auVar368[5] = uVar240;
        auVar368[4] = uVar327;
        uVar239 = (undefined1)(uVar3 >> 8);
        auVar368[3] = uVar239;
        auVar368[2] = uVar326;
        auVar368._0_2_ = CONCAT11((char)uVar3,bVar358);
        auVar298._0_4_ =
             (auVar297._0_4_ + auVar341._0_4_ + auVar329._0_4_ + auVar235._0_4_ << iVar205) +
             iVar234 >> auVar287;
        auVar298._4_4_ =
             auVar297._4_4_ + auVar341._4_4_ + auVar329._4_4_ + auVar235._4_4_ + iVar234 >> auVar287
        ;
        auVar298._8_4_ =
             auVar297._8_4_ + auVar341._8_4_ + auVar329._8_4_ + auVar235._8_4_ + iVar234 >> auVar287
        ;
        auVar298._12_4_ =
             auVar297._12_4_ + auVar341._12_4_ + auVar329._12_4_ + auVar235._12_4_ + iVar234 >>
             auVar287;
        auVar235 = packssdw(auVar355,auVar298);
        sVar216 = auVar235._0_2_ + sVar242;
        sVar226 = auVar235._2_2_ + sVar259;
        sVar227 = auVar235._4_2_ + sVar242;
        sVar228 = auVar235._6_2_ + sVar259;
        sVar229 = auVar235._8_2_ + sVar242;
        sVar230 = auVar235._10_2_ + sVar259;
        sVar231 = auVar235._12_2_ + sVar242;
        sVar232 = auVar235._14_2_ + sVar259;
        if (iVar209 == 0) {
          *(short *)*pauVar203 = sVar216;
          *(short *)(*pauVar203 + 2) = sVar226;
          *(short *)(*pauVar203 + 4) = sVar227;
          *(short *)(*pauVar203 + 6) = sVar228;
          *(short *)(*pauVar203 + 8) = sVar229;
          *(short *)(*pauVar203 + 10) = sVar230;
          *(short *)(*pauVar203 + 0xc) = sVar231;
          *(short *)(*pauVar203 + 0xe) = sVar232;
        }
        else {
          auVar235 = *pauVar203;
          if (iVar6 == 0) {
            auVar318._0_2_ = auVar235._0_2_ + sVar216;
            auVar318._2_2_ = auVar235._2_2_ + sVar226;
            auVar318._4_2_ = auVar235._4_2_ + sVar227;
            auVar318._6_2_ = auVar235._6_2_ + sVar228;
            auVar318._8_2_ = auVar235._8_2_ + sVar229;
            auVar318._10_2_ = auVar235._10_2_ + sVar230;
            auVar318._12_2_ = auVar235._12_2_ + sVar231;
            auVar318._14_2_ = auVar235._14_2_ + sVar232;
            auVar235 = psraw(auVar318,1);
          }
          else {
            auVar302._0_12_ = auVar235._0_12_;
            auVar302._12_2_ = auVar235._6_2_;
            auVar302._14_2_ = sVar228;
            auVar301._12_4_ = auVar302._12_4_;
            auVar301._0_10_ = auVar235._0_10_;
            auVar301._10_2_ = sVar227;
            auVar300._10_6_ = auVar301._10_6_;
            auVar300._0_8_ = auVar235._0_8_;
            auVar300._8_2_ = auVar235._4_2_;
            auVar299._8_8_ = auVar300._8_8_;
            auVar299._6_2_ = sVar226;
            auVar299._4_2_ = auVar235._2_2_;
            auVar299._2_2_ = sVar216;
            auVar299._0_2_ = auVar235._0_2_;
            auVar316._2_2_ = sVar229;
            auVar316._0_2_ = auVar235._8_2_;
            auVar316._4_2_ = auVar235._10_2_;
            auVar316._6_2_ = sVar230;
            auVar316._8_2_ = auVar235._12_2_;
            auVar316._10_2_ = sVar231;
            auVar316._12_2_ = auVar235._14_2_;
            auVar316._14_2_ = sVar232;
            auVar133._4_4_ = uVar233;
            auVar133._0_4_ = uVar233;
            auVar133._8_4_ = uVar233;
            auVar133._12_4_ = uVar233;
            auVar235 = pmaddwd(auVar299,auVar133);
            auVar245 = pmaddwd(auVar316,auVar133);
            auVar303._0_4_ = auVar235._0_4_ >> 4;
            auVar303._4_4_ = auVar235._4_4_ >> 4;
            auVar303._8_4_ = auVar235._8_4_ >> 4;
            auVar303._12_4_ = auVar235._12_4_ >> 4;
            auVar317._0_4_ = auVar245._0_4_ >> 4;
            auVar317._4_4_ = auVar245._4_4_ >> 4;
            auVar317._8_4_ = auVar245._8_4_ >> 4;
            auVar317._12_4_ = auVar245._12_4_ >> 4;
            auVar235 = packssdw(auVar303,auVar317);
          }
          auVar304._0_2_ = auVar235._0_2_ + (sVar324 - sVar242);
          auVar304._2_2_ = auVar235._2_2_ + (sVar325 - sVar259);
          auVar304._4_2_ = auVar235._4_2_ + (sVar324 - sVar242);
          auVar304._6_2_ = auVar235._6_2_ + (sVar325 - sVar259);
          auVar304._8_2_ = auVar235._8_2_ + (sVar324 - sVar242);
          auVar304._10_2_ = auVar235._10_2_ + (sVar325 - sVar259);
          auVar304._12_2_ = auVar235._12_2_ + (sVar324 - sVar242);
          auVar304._14_2_ = auVar235._14_2_ + (sVar325 - sVar259);
          auVar235 = psraw(auVar304,ZEXT416(uVar200));
          sVar216 = auVar235._0_2_;
          sVar226 = auVar235._2_2_;
          sVar227 = auVar235._4_2_;
          sVar228 = auVar235._6_2_;
          sVar229 = auVar235._8_2_;
          sVar230 = auVar235._10_2_;
          sVar231 = auVar235._12_2_;
          sVar232 = auVar235._14_2_;
          *(ulong *)(puVar201 + lVar210) =
               CONCAT17((0 < sVar232) * (sVar232 < 0x100) * auVar235[0xe] - (0xff < sVar232),
                        CONCAT16((0 < sVar231) * (sVar231 < 0x100) * auVar235[0xc] -
                                 (0xff < sVar231),
                                 CONCAT15((0 < sVar230) * (sVar230 < 0x100) * auVar235[10] -
                                          (0xff < sVar230),
                                          CONCAT14((0 < sVar229) * (sVar229 < 0x100) * auVar235[8] -
                                                   (0xff < sVar229),
                                                   CONCAT13((0 < sVar228) * (sVar228 < 0x100) *
                                                            auVar235[6] - (0xff < sVar228),
                                                            CONCAT12((0 < sVar227) *
                                                                     (sVar227 < 0x100) * auVar235[4]
                                                                     - (0xff < sVar227),
                                                                     CONCAT11((0 < sVar226) *
                                                                              (sVar226 < 0x100) *
                                                                              auVar235[2] -
                                                                              (0xff < sVar226),
                                                                              (0 < sVar216) *
                                                                              (sVar216 < 0x100) *
                                                                              auVar235[0] -
                                                                              (0xff < sVar216)))))))
                       );
        }
        auVar25[0xd] = 0;
        auVar25._0_13_ = auVar261._0_13_;
        auVar25[0xe] = auVar261[7];
        auVar41[0xc] = auVar261[6];
        auVar41._0_12_ = auVar261._0_12_;
        auVar41._13_2_ = auVar25._13_2_;
        auVar57[0xb] = 0;
        auVar57._0_11_ = auVar261._0_11_;
        auVar57._12_3_ = auVar41._12_3_;
        auVar73[10] = auVar261[5];
        auVar73._0_10_ = auVar261._0_10_;
        auVar73._11_4_ = auVar57._11_4_;
        auVar89[9] = 0;
        auVar89._0_9_ = auVar261._0_9_;
        auVar89._10_5_ = auVar73._10_5_;
        auVar105[8] = auVar261[4];
        auVar105._0_8_ = auVar261._0_8_;
        auVar105._9_6_ = auVar89._9_6_;
        auVar163._7_8_ = 0;
        auVar163._0_7_ = auVar105._8_7_;
        auVar191._1_8_ = SUB158(auVar163 << 0x40,7);
        auVar191[0] = auVar261[3];
        auVar191._9_6_ = 0;
        auVar192._1_10_ = SUB1510(auVar191 << 0x30,5);
        auVar192[0] = auVar261[2];
        auVar192._11_4_ = 0;
        auVar119[2] = auVar261[1];
        auVar119._0_2_ = auVar261._0_2_;
        auVar119._3_12_ = SUB1512(auVar192 << 0x20,3);
        auVar305._0_2_ = auVar261._0_2_ & 0xff;
        auVar305._2_13_ = auVar119._2_13_;
        auVar305[0xf] = 0;
        auVar26[0xd] = 0;
        auVar26._0_13_ = auVar223._0_13_;
        auVar26[0xe] = auVar223[7];
        auVar42[0xc] = auVar223[6];
        auVar42._0_12_ = auVar223._0_12_;
        auVar42._13_2_ = auVar26._13_2_;
        auVar58[0xb] = 0;
        auVar58._0_11_ = auVar223._0_11_;
        auVar58._12_3_ = auVar42._12_3_;
        auVar74[10] = auVar223[5];
        auVar74._0_10_ = auVar223._0_10_;
        auVar74._11_4_ = auVar58._11_4_;
        auVar90[9] = 0;
        auVar90._0_9_ = auVar223._0_9_;
        auVar90._10_5_ = auVar74._10_5_;
        auVar106[8] = auVar223[4];
        auVar106._0_8_ = auVar223._0_8_;
        auVar106._9_6_ = auVar90._9_6_;
        auVar164._7_8_ = 0;
        auVar164._0_7_ = auVar106._8_7_;
        auVar193._1_8_ = SUB158(auVar164 << 0x40,7);
        auVar193[0] = auVar223[3];
        auVar193._9_6_ = 0;
        auVar194._1_10_ = SUB1510(auVar193 << 0x30,5);
        auVar194[0] = auVar223[2];
        auVar194._11_4_ = 0;
        auVar120[2] = auVar223[1];
        auVar120._0_2_ = auVar223._0_2_;
        auVar120._3_12_ = SUB1512(auVar194 << 0x20,3);
        auVar319._0_2_ = auVar223._0_2_ & 0xff;
        auVar319._2_13_ = auVar120._2_13_;
        auVar319[0xf] = 0;
        auVar150._4_4_ = uVar127;
        auVar150._0_4_ = uVar127;
        auVar150._8_4_ = uVar127;
        auVar150._12_4_ = uVar127;
        auVar235 = pmaddwd(auVar305,auVar150);
        auVar146._4_4_ = uVar128;
        auVar146._0_4_ = uVar128;
        auVar146._8_4_ = uVar128;
        auVar146._12_4_ = uVar128;
        auVar295 = pmaddwd(auVar319,auVar146);
        auVar27[0xd] = 0;
        auVar27._0_13_ = auVar360._0_13_;
        auVar27[0xe] = auVar360[7];
        auVar43[0xc] = auVar360[6];
        auVar43._0_12_ = auVar360._0_12_;
        auVar43._13_2_ = auVar27._13_2_;
        auVar59[0xb] = 0;
        auVar59._0_11_ = auVar360._0_11_;
        auVar59._12_3_ = auVar43._12_3_;
        auVar75[10] = auVar360[5];
        auVar75._0_10_ = auVar360._0_10_;
        auVar75._11_4_ = auVar59._11_4_;
        auVar91[9] = 0;
        auVar91._0_9_ = auVar360._0_9_;
        auVar91._10_5_ = auVar75._10_5_;
        auVar107[8] = auVar360[4];
        auVar107._0_8_ = auVar360._0_8_;
        auVar107._9_6_ = auVar91._9_6_;
        auVar165._7_8_ = 0;
        auVar165._0_7_ = auVar107._8_7_;
        auVar195._1_8_ = SUB158(auVar165 << 0x40,7);
        auVar195[0] = auVar360[3];
        auVar195._9_6_ = 0;
        auVar196._1_10_ = SUB1510(auVar195 << 0x30,5);
        auVar196[0] = auVar360[2];
        auVar196._11_4_ = 0;
        auVar121[2] = auVar360[1];
        auVar121._0_2_ = auVar360._0_2_;
        auVar121._3_12_ = SUB1512(auVar196 << 0x20,3);
        auVar306._0_2_ = auVar360._0_2_ & 0xff;
        auVar306._2_13_ = auVar121._2_13_;
        auVar306[0xf] = 0;
        auVar142._4_4_ = uVar129;
        auVar142._0_4_ = uVar129;
        auVar142._8_4_ = uVar129;
        auVar142._12_4_ = uVar129;
        auVar245 = pmaddwd(auVar306,auVar142);
        auVar28[0xd] = 0;
        auVar28._0_13_ = auVar368._0_13_;
        auVar28[0xe] = uVar241;
        auVar44[0xc] = uVar330;
        auVar44._0_12_ = auVar368._0_12_;
        auVar44._13_2_ = auVar28._13_2_;
        auVar60[0xb] = 0;
        auVar60._0_11_ = auVar368._0_11_;
        auVar60._12_3_ = auVar44._12_3_;
        auVar76[10] = uVar240;
        auVar76._0_10_ = auVar368._0_10_;
        auVar76._11_4_ = auVar60._11_4_;
        auVar92[9] = 0;
        auVar92._0_9_ = auVar368._0_9_;
        auVar92._10_5_ = auVar76._10_5_;
        auVar108[8] = uVar327;
        auVar108._0_8_ = auVar368._0_8_;
        auVar108._9_6_ = auVar92._9_6_;
        auVar166._7_8_ = 0;
        auVar166._0_7_ = auVar108._8_7_;
        auVar197._1_8_ = SUB158(auVar166 << 0x40,7);
        auVar197[0] = uVar239;
        auVar197._9_6_ = 0;
        auVar198._1_10_ = SUB1510(auVar197 << 0x30,5);
        auVar198[0] = uVar326;
        auVar198._11_4_ = 0;
        auVar122[2] = (char)uVar3;
        auVar122._0_2_ = auVar368._0_2_;
        auVar122._3_12_ = SUB1512(auVar198 << 0x20,3);
        auVar356[1] = 0;
        auVar356[0] = bVar358;
        auVar356._2_13_ = auVar122._2_13_;
        auVar356[0xf] = 0;
        auVar138._4_4_ = uVar130;
        auVar138._0_4_ = uVar130;
        auVar138._8_4_ = uVar130;
        auVar138._12_4_ = uVar130;
        auVar341 = pmaddwd(auVar356,auVar138);
        auVar352[1] = 0;
        auVar352[0] = auVar261[8];
        auVar352[2] = auVar261[9];
        auVar352[3] = 0;
        auVar352[4] = auVar261[10];
        auVar352[5] = 0;
        auVar352[6] = auVar261[0xb];
        auVar352[7] = 0;
        auVar352[8] = auVar261[0xc];
        auVar352[9] = 0;
        auVar352[10] = auVar261[0xd];
        auVar352[0xb] = 0;
        auVar352[0xc] = auVar261[0xe];
        auVar352[0xd] = 0;
        auVar352[0xe] = auVar261[0xf];
        auVar352[0xf] = 0;
        auVar307[1] = 0;
        auVar307[0] = auVar223[8];
        auVar307[2] = auVar223[9];
        auVar307[3] = 0;
        auVar307[4] = auVar223[10];
        auVar307[5] = 0;
        auVar307[6] = auVar223[0xb];
        auVar307[7] = 0;
        auVar307[8] = auVar223[0xc];
        auVar307[9] = 0;
        auVar307[10] = auVar223[0xd];
        auVar307[0xb] = 0;
        auVar307[0xc] = auVar223[0xe];
        auVar307[0xd] = 0;
        auVar307[0xe] = auVar223[0xf];
        auVar307[0xf] = 0;
        auVar329 = pmaddwd(auVar352,auVar150);
        auVar261 = pmaddwd(auVar307,auVar146);
        auVar320[1] = 0;
        auVar320[0] = auVar360[8];
        auVar320[2] = auVar360[9];
        auVar320[3] = 0;
        auVar320[4] = auVar360[10];
        auVar320[5] = 0;
        auVar320[6] = auVar360[0xb];
        auVar320[7] = 0;
        auVar320[8] = auVar360[0xc];
        auVar320[9] = 0;
        auVar320[10] = auVar360[0xd];
        auVar320[0xb] = 0;
        auVar320[0xc] = auVar360[0xe];
        auVar320[0xd] = 0;
        auVar320[0xe] = auVar360[0xf];
        auVar320[0xf] = 0;
        auVar297 = pmaddwd(auVar320,auVar142);
        auVar308[1] = 0;
        auVar308[0] = bVar377;
        auVar308[2] = uVar282;
        auVar308[3] = 0;
        auVar308[4] = uVar331;
        auVar308[5] = 0;
        auVar308[6] = uVar283;
        auVar308[7] = 0;
        auVar308[8] = uVar332;
        auVar308[9] = 0;
        auVar308[10] = uVar284;
        auVar308[0xb] = 0;
        auVar308[0xc] = uVar342;
        auVar308[0xd] = 0;
        auVar308[0xe] = uVar286;
        auVar308[0xf] = 0;
        auVar238 = pmaddwd(auVar308,auVar138);
        auVar357._0_4_ =
             (auVar341._0_4_ + auVar245._0_4_ + auVar295._0_4_ + auVar235._0_4_ << iVar205) +
             iVar234 >> auVar287;
        auVar357._4_4_ =
             auVar341._4_4_ + auVar245._4_4_ + auVar295._4_4_ + auVar235._4_4_ + iVar234 >> auVar287
        ;
        auVar357._8_4_ =
             auVar341._8_4_ + auVar245._8_4_ + auVar295._8_4_ + auVar235._8_4_ + iVar234 >> auVar287
        ;
        auVar357._12_4_ =
             auVar341._12_4_ + auVar245._12_4_ + auVar295._12_4_ + auVar235._12_4_ + iVar234 >>
             auVar287;
        auVar309._0_4_ =
             (auVar238._0_4_ + auVar297._0_4_ + auVar261._0_4_ + auVar329._0_4_ << iVar205) +
             iVar234 >> auVar287;
        auVar309._4_4_ =
             auVar238._4_4_ + auVar297._4_4_ + auVar261._4_4_ + auVar329._4_4_ + iVar234 >> auVar287
        ;
        auVar309._8_4_ =
             auVar238._8_4_ + auVar297._8_4_ + auVar261._8_4_ + auVar329._8_4_ + iVar234 >> auVar287
        ;
        auVar309._12_4_ =
             auVar238._12_4_ + auVar297._12_4_ + auVar261._12_4_ + auVar329._12_4_ + iVar234 >>
             auVar287;
        auVar235 = packssdw(auVar357,auVar309);
        sVar216 = auVar235._0_2_ + sVar242;
        sVar226 = auVar235._2_2_ + sVar259;
        sVar227 = auVar235._4_2_ + sVar242;
        sVar228 = auVar235._6_2_ + sVar259;
        sVar229 = auVar235._8_2_ + sVar242;
        sVar230 = auVar235._10_2_ + sVar259;
        sVar231 = auVar235._12_2_ + sVar242;
        sVar232 = auVar235._14_2_ + sVar259;
        if (iVar209 == 0) {
          psVar2 = (short *)(*pauVar203 + lVar213 * 2);
          *psVar2 = sVar216;
          psVar2[1] = sVar226;
          psVar2[2] = sVar227;
          psVar2[3] = sVar228;
          psVar2[4] = sVar229;
          psVar2[5] = sVar230;
          psVar2[6] = sVar231;
          psVar2[7] = sVar232;
        }
        else {
          auVar235 = *(undefined1 (*) [16])(*pauVar203 + lVar213 * 2);
          if (iVar6 == 0) {
            auVar323._0_2_ = auVar235._0_2_ + sVar216;
            auVar323._2_2_ = auVar235._2_2_ + sVar226;
            auVar323._4_2_ = auVar235._4_2_ + sVar227;
            auVar323._6_2_ = auVar235._6_2_ + sVar228;
            auVar323._8_2_ = auVar235._8_2_ + sVar229;
            auVar323._10_2_ = auVar235._10_2_ + sVar230;
            auVar323._12_2_ = auVar235._12_2_ + sVar231;
            auVar323._14_2_ = auVar235._14_2_ + sVar232;
            auVar235 = psraw(auVar323,1);
          }
          else {
            auVar313._0_12_ = auVar235._0_12_;
            auVar313._12_2_ = auVar235._6_2_;
            auVar313._14_2_ = sVar228;
            auVar312._12_4_ = auVar313._12_4_;
            auVar312._0_10_ = auVar235._0_10_;
            auVar312._10_2_ = sVar227;
            auVar311._10_6_ = auVar312._10_6_;
            auVar311._0_8_ = auVar235._0_8_;
            auVar311._8_2_ = auVar235._4_2_;
            auVar310._8_8_ = auVar311._8_8_;
            auVar310._6_2_ = sVar226;
            auVar310._4_2_ = auVar235._2_2_;
            auVar310._2_2_ = sVar216;
            auVar310._0_2_ = auVar235._0_2_;
            auVar321._2_2_ = sVar229;
            auVar321._0_2_ = auVar235._8_2_;
            auVar321._4_2_ = auVar235._10_2_;
            auVar321._6_2_ = sVar230;
            auVar321._8_2_ = auVar235._12_2_;
            auVar321._10_2_ = sVar231;
            auVar321._12_2_ = auVar235._14_2_;
            auVar321._14_2_ = sVar232;
            auVar134._4_4_ = uVar233;
            auVar134._0_4_ = uVar233;
            auVar134._8_4_ = uVar233;
            auVar134._12_4_ = uVar233;
            auVar235 = pmaddwd(auVar310,auVar134);
            auVar245 = pmaddwd(auVar321,auVar134);
            auVar314._0_4_ = auVar235._0_4_ >> 4;
            auVar314._4_4_ = auVar235._4_4_ >> 4;
            auVar314._8_4_ = auVar235._8_4_ >> 4;
            auVar314._12_4_ = auVar235._12_4_ >> 4;
            auVar322._0_4_ = auVar245._0_4_ >> 4;
            auVar322._4_4_ = auVar245._4_4_ >> 4;
            auVar322._8_4_ = auVar245._8_4_ >> 4;
            auVar322._12_4_ = auVar245._12_4_ >> 4;
            auVar235 = packssdw(auVar314,auVar322);
          }
          auVar315._0_2_ = auVar235._0_2_ + (sVar324 - sVar242);
          auVar315._2_2_ = auVar235._2_2_ + (sVar325 - sVar259);
          auVar315._4_2_ = auVar235._4_2_ + (sVar324 - sVar242);
          auVar315._6_2_ = auVar235._6_2_ + (sVar325 - sVar259);
          auVar315._8_2_ = auVar235._8_2_ + (sVar324 - sVar242);
          auVar315._10_2_ = auVar235._10_2_ + (sVar325 - sVar259);
          auVar315._12_2_ = auVar235._12_2_ + (sVar324 - sVar242);
          auVar315._14_2_ = auVar235._14_2_ + (sVar325 - sVar259);
          auVar235 = psraw(auVar315,ZEXT416(uVar200));
          sVar216 = auVar235._0_2_;
          sVar226 = auVar235._2_2_;
          sVar227 = auVar235._4_2_;
          sVar228 = auVar235._6_2_;
          sVar229 = auVar235._8_2_;
          sVar230 = auVar235._10_2_;
          sVar231 = auVar235._12_2_;
          sVar232 = auVar235._14_2_;
          *(ulong *)(puVar204 + lVar210) =
               CONCAT17((0 < sVar232) * (sVar232 < 0x100) * auVar235[0xe] - (0xff < sVar232),
                        CONCAT16((0 < sVar231) * (sVar231 < 0x100) * auVar235[0xc] -
                                 (0xff < sVar231),
                                 CONCAT15((0 < sVar230) * (sVar230 < 0x100) * auVar235[10] -
                                          (0xff < sVar230),
                                          CONCAT14((0 < sVar229) * (sVar229 < 0x100) * auVar235[8] -
                                                   (0xff < sVar229),
                                                   CONCAT13((0 < sVar228) * (sVar228 < 0x100) *
                                                            auVar235[6] - (0xff < sVar228),
                                                            CONCAT12((0 < sVar227) *
                                                                     (sVar227 < 0x100) * auVar235[4]
                                                                     - (0xff < sVar227),
                                                                     CONCAT11((0 < sVar226) *
                                                                              (sVar226 < 0x100) *
                                                                              auVar235[2] -
                                                                              (0xff < sVar226),
                                                                              (0 < sVar216) *
                                                                              (sVar216 < 0x100) *
                                                                              auVar235[0] -
                                                                              (0xff < sVar216)))))))
                       );
        }
        lVar215 = lVar215 + 2;
        puVar204 = puVar204 + lVar14;
        pauVar203 = (undefined1 (*) [16])(*pauVar203 + lVar213 * 4);
        puVar201 = puVar201 + lVar14;
        puVar212 = puVar212 + lVar214 * 2;
        puVar207 = puVar207 + lVar214 * 2;
        auVar235 = local_148;
        auVar245 = auVar360;
        auVar261 = auVar223;
        auVar360 = auVar368;
        local_148 = auVar224;
      } while (lVar215 < h);
      lVar210 = lVar210 + 8;
      pauVar202 = pauVar202 + 1;
    } while (lVar210 < w);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i wt0 = _mm_set1_epi16(conv_params->fwd_offset);
  const __m128i wt1 = _mm_set1_epi16(conv_params->bck_offset);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

  if (w == 4) {
    __m128i s[8], src6, res, res_shift;
    s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                             xx_loadl_32(src_ptr + 1 * src_stride));
    s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                             xx_loadl_32(src_ptr + 2 * src_stride));
    s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                             xx_loadl_32(src_ptr + 3 * src_stride));
    s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                             xx_loadl_32(src_ptr + 4 * src_stride));
    s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                             xx_loadl_32(src_ptr + 5 * src_stride));
    src6 = xx_loadl_32(src_ptr + 6 * src_stride);
    s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

    do {
      s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
      src6 = xx_loadl_32(src_ptr + 8 * src_stride);
      s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

      res = convolve_lo_y(s + 0, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      __m128i res_16b = _mm_packs_epi32(res_shift, res_shift);
      __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      res = convolve_lo_y(s + 1, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      res_16b = _mm_packs_epi32(res_shift, res_shift);
      res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
      s[3] = s[5];
      s[4] = s[6];
      s[5] = s[7];
      h -= 2;
    } while (h);
  } else {
    assert(!(w % 8));
    int j = 0;
    do {
      __m128i s[8], src6, res_lo, res_hi, res_lo_shift, res_hi_shift;
      const uint8_t *data = &src_ptr[j];

      src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
      s[0] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
      s[1] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
      s[2] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
      s[3] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
      s[4] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
      s[5] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

      int i = 0;
      do {
        data = &src_ptr[i * src_stride + j];
        s[6] = _mm_unpacklo_epi8(
            src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
        src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
        s[7] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

        res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);

        __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);
        res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
      } while (i < h);
      j += 8;
    } while (j < w);
  }
}